

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

int NGA_Locate_num_blocks(int g_a,int *lo,int *hi)

{
  long lVar1;
  Integer IVar2;
  long lVar3;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer aIStack_98 [7];
  long lStack_60;
  Integer local_58 [8];
  
  lVar1 = pnga_ndim((long)g_a);
  lVar3 = lVar1;
  if (0 < lVar1) {
    do {
      (&lStack_60)[lVar3] = (long)*lo + 1;
      lo = lo + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    if (0 < lVar1) {
      do {
        aIStack_98[lVar1 + -1] = (long)*hi + 1;
        hi = hi + 1;
        lVar1 = lVar1 + -1;
      } while (lVar1 != 0);
    }
  }
  IVar2 = pnga_locate_num_blocks((long)g_a,local_58,aIStack_98);
  return (int)IVar2;
}

Assistant:

int NGA_Locate_num_blocks(int g_a, int *lo, int *hi)
{
  Integer ret;
  Integer a = (Integer)g_a;
  Integer ndim = wnga_ndim(a);
  Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
  COPYINDEX_C2F(lo,_ga_lo,ndim);
  COPYINDEX_C2F(hi,_ga_hi,ndim);
  ret = wnga_locate_num_blocks(a, _ga_lo, _ga_hi);
  return (int)ret;
}